

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_builder.cc
# Opt level: O3

string * __thiscall
iqxmlrpc::XmlBuilder::content_abi_cxx11_(string *__return_storage_ptr__,XmlBuilder *this)

{
  uint uVar1;
  long lVar2;
  
  xmlTextWriterFlush(this->writer);
  lVar2 = xmlBufferContent(this->buf);
  uVar1 = this->buf->use;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,lVar2,(ulong)uVar1 + lVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string
XmlBuilder::content() const
{
  xmlTextWriterFlush(writer);
  const char* cdata = reinterpret_cast<const char*>(xmlBufferContent(buf));
  return std::string(cdata, buf->use);
}